

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O3

int dwarf_get_GNUIKIND_name(uint val,char **s_out)

{
  int iVar1;
  
  iVar1 = -1;
  if (val < 5) {
    *s_out = &DAT_001eddf8 + *(int *)(&DAT_001eddf8 + (ulong)val * 4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
dwarf_get_GNUIKIND_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_GNUIKIND_none:
        *s_out = "DW_GNUIKIND_none";
        return DW_DLV_OK;
    case DW_GNUIKIND_type:
        *s_out = "DW_GNUIKIND_type";
        return DW_DLV_OK;
    case DW_GNUIKIND_variable:
        *s_out = "DW_GNUIKIND_variable";
        return DW_DLV_OK;
    case DW_GNUIKIND_function:
        *s_out = "DW_GNUIKIND_function";
        return DW_DLV_OK;
    case DW_GNUIKIND_other:
        *s_out = "DW_GNUIKIND_other";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}